

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_rec rf_image_alpha_border(rf_image image,float threshold)

{
  long lVar1;
  rf_source_location source_location;
  rf_image image_00;
  rf_rec rVar2;
  rf_pixel_format src_format;
  _Bool _Var3;
  int iVar4;
  rf_color rVar5;
  undefined8 in_R9;
  long *in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffff50;
  undefined4 uStack_84;
  rf_color rgba32_pixel;
  int src_pos;
  rf_int x;
  rf_int y;
  uchar *src;
  int src_size;
  int src_bpp;
  int y_max;
  int y_min;
  int x_max;
  int x_min;
  float threshold_local;
  rf_rec crop;
  
  memset(&x_min,0,0x10);
  src_format = image.format;
  _Var3 = rf_is_uncompressed_format(image.format);
  if (_Var3) {
    y_min = 0x10000;
    y_max = 0;
    src_bpp = 0x10000;
    src_size = 0;
    iVar4 = rf_bytes_per_pixel(image.format);
    image_00.format = (int)in_stack_ffffffffffffff50;
    image_00.valid = (_Bool)(char)((ulong)in_stack_ffffffffffffff50 >> 0x20);
    image_00._21_3_ = (int3)((ulong)in_stack_ffffffffffffff50 >> 0x28);
    image_00._0_16_ = image._8_16_;
    rf_image_size(image_00);
    for (x = 0; x < image.height; x = x + 1) {
      for (_rgba32_pixel = 0; _rgba32_pixel < image.width; _rgba32_pixel = _rgba32_pixel + 1) {
        rVar5 = rf_format_one_pixel_to_rgba32
                          ((void *)((long)image.data +
                                   (long)(((int)x * image.width + (int)rgba32_pixel) * iVar4)),
                           src_format);
        if (((int)(threshold * 255.0) & 0xffU) < (uint)rVar5 >> 0x18) {
          if (_rgba32_pixel < y_min) {
            y_min = (int)rgba32_pixel;
          }
          if (y_max < _rgba32_pixel) {
            y_max = (int)rgba32_pixel;
          }
          if (x < src_bpp) {
            src_bpp = (int)x;
          }
          if (src_size < x) {
            src_size = (int)x;
          }
        }
      }
    }
    _x_min = CONCAT44((float)src_bpp,(float)y_min);
    crop.y = (float)((src_size + 1) - src_bpp);
    crop.x = (float)((y_max + 1) - y_min);
  }
  else {
    source_location.proc_name = "rf_image_alpha_border";
    source_location.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    source_location.line_in_file = 0x3c36;
    rf_log_impl(source_location,RF_LOG_TYPE_ERROR,
                "Function only works for uncompressed formats but was called with format %d.",1,
                (ulong)image.format,"rf_image_alpha_border",in_R9);
    lVar1 = *in_FS_OFFSET;
    *(char **)(lVar1 + -0x460) =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    *(char **)(lVar1 + -0x458) = "rf_image_alpha_border";
    *(undefined8 *)(lVar1 + -0x450) = 0x3c36;
    *(ulong *)(lVar1 + -0x448) = CONCAT44(uStack_84,1);
  }
  rVar2.width = crop.x;
  rVar2.height = crop.y;
  rVar2.x = (float)x_min;
  rVar2.y = threshold_local;
  return rVar2;
}

Assistant:

RF_API rf_rec rf_image_alpha_border(rf_image image, float threshold)
{
    rf_rec crop = {0};

    if (rf_is_uncompressed_format(image.format))
    {
        int x_min = 65536; // Define a big enough number
        int x_max = 0;
        int y_min = 65536;
        int y_max = 0;

        int src_bpp = rf_bytes_per_pixel(image.format);
        int src_size = rf_image_size(image);
        unsigned char* src = image.data;

        for (rf_int y = 0; y < image.height; y++)
        {
            for (rf_int x = 0; x < image.width; x++)
            {
                int src_pos = (y * image.width + x) * src_bpp;

                rf_color rgba32_pixel = rf_format_one_pixel_to_rgba32(&src[src_pos], image.format);

                if (rgba32_pixel.a > (unsigned char)(threshold * 255.0f))
                {
                    if (x < x_min) x_min = x;
                    if (x > x_max) x_max = x;
                    if (y < y_min) y_min = y;
                    if (y > y_max) y_max = y;
                }
            }
        }

        crop = (rf_rec) { x_min, y_min, (x_max + 1) - x_min, (y_max + 1) - y_min };
    }
    else RF_LOG_ERROR(RF_BAD_ARGUMENT, "Function only works for uncompressed formats but was called with format %d.", image.format);

    return crop;
}